

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void DecoalesceMergedSets(ExpressionContext *ctx,VmFunction *function)

{
  VmBlock *pVVar1;
  VmInstruction *variable;
  VmBlock **ppVVar2;
  VmInstruction **ppVVar3;
  uint uVar4;
  uint i;
  uint uVar5;
  uint index;
  VmInstruction *inst;
  VmInstruction *pVVar6;
  VmInstruction *pVVar7;
  SmallArray<VmInstruction_*,_32U> mergedSet;
  
  ppVVar2 = &function->firstBlock;
  while (pVVar1 = *ppVVar2, pVVar1 != (VmBlock *)0x0) {
    pVVar7 = pVVar1->firstInstruction;
    while (inst = pVVar7, inst != (VmInstruction *)0x0) {
      pVVar7 = inst->nextSibling;
      if ((inst->cmd == VM_INST_PHI) && (inst->marker == 0)) {
        mergedSet.allocator = ctx->allocator;
        mergedSet.data = mergedSet.little;
        mergedSet.count = 0;
        mergedSet.max = 0x20;
        CollectMergedSet(inst,inst->color,&mergedSet);
        qsort(mergedSet.data,mergedSet._8_8_ & 0xffffffff,8,SortByDominancePreOrder);
        pVVar6 = (VmInstruction *)0x0;
        for (uVar5 = 0; uVar5 < mergedSet.count; uVar5 = uVar5 + 1) {
          ppVVar3 = SmallArray<VmInstruction_*,_32U>::operator[](&mergedSet,uVar5);
          variable = *ppVVar3;
          DeCoalesce(variable,function,pVVar6);
          pVVar6 = variable;
        }
        for (uVar5 = 0; uVar5 < mergedSet.count; uVar5 = uVar5 + 1) {
          ppVVar3 = SmallArray<VmInstruction_*,_32U>::operator[](&mergedSet,uVar5);
          if ((*ppVVar3)->color == 0) {
            (*ppVVar3)->marker = 0;
          }
        }
        uVar5 = inst->color;
        uVar4 = mergedSet.count;
        for (index = 0; index < uVar4; index = index + 1) {
          ppVVar3 = SmallArray<VmInstruction_*,_32U>::operator[](&mergedSet,index);
          pVVar6 = *ppVVar3;
          if ((pVVar6->cmd == VM_INST_PHI) && (pVVar6->color == 0)) {
            uVar4 = function->nextColor + 1;
            function->nextColor = uVar4;
            ColorPhiWeb(pVVar6,uVar4);
          }
          uVar4 = mergedSet.count;
        }
        if (uVar5 == 0) {
          pVVar7 = inst;
        }
        SmallArray<VmInstruction_*,_32U>::~SmallArray(&mergedSet);
      }
    }
    ppVVar2 = &pVVar1->nextSibling;
  }
  return;
}

Assistant:

void DecoalesceMergedSets(ExpressionContext &ctx, VmFunction* function)
{
	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		for(VmInstruction *inst = block->firstInstruction; inst;)
		{
			VmInstruction *next = inst->nextSibling;

			if(inst->cmd == VM_INST_PHI && inst->marker == 0)
			{
				SmallArray<VmInstruction*, 32> mergedSet(ctx.allocator);

				CollectMergedSet(inst, inst->color, mergedSet);

				// Now sort merged set in depth-first-search pre-order of the dominance tree
				qsort(mergedSet.data, mergedSet.count, sizeof(mergedSet[0]), SortByDominancePreOrder);

				VmInstruction *currImmediateDominator = NULL;

				for(unsigned i = 0; i < mergedSet.size(); i++)
				{
					VmInstruction *variable = mergedSet[i];

					DeCoalesce(variable, function, currImmediateDominator);

					currImmediateDominator = variable;
				}

				// Clear markers of uncolored variables
				for(unsigned i = 0; i < mergedSet.size(); i++)
				{
					VmInstruction *variable = mergedSet[i];

					if(variable->color == 0)
						variable->marker = 0;
				}

				// If current phi was uncolored, retry iteration
				if(inst->color == 0)
					next = inst;

				// Assign new colors to uncolored phi webs
				for(unsigned i = 0; i < mergedSet.size(); i++)
				{
					VmInstruction *variable = mergedSet[i];

					if(variable->cmd == VM_INST_PHI && variable->color == 0)
						ColorPhiWeb(variable, ++function->nextColor);
				}
			}

			inst = next;
		}
	}
}